

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

Cofaces_simplex_range * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
cofaces_simplex_range
          (Cofaces_simplex_range *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          Simplex_handle *simplex,int codimension)

{
  short sVar1;
  int iVar2;
  short *psVar3;
  int nbVertices;
  short *psVar4;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
  __first;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
  __last;
  vector<short,_std::allocator<short>_> copy;
  Simplex_vertex_range rg;
  allocator_type local_61;
  vector<short,_std::allocator<short>_> local_60;
  Simplex_handle local_48;
  undefined1 local_40 [12];
  undefined1 local_30 [12];
  
  if (codimension < 0) {
    __assert_fail("codimension >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x59f,
                  "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence]"
                 );
  }
  (__return_storage_ptr__->
  super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (Simplex_handle)simplex->m_ptr;
  simplex_vertex_range((Simplex_vertex_range *)local_40,this,&local_48);
  __first._12_4_ = 0;
  __first.sib_ = (Siblings *)local_40._0_8_;
  __first.v_ = local_40._8_2_;
  __first._10_2_ = local_40._10_2_;
  __last._12_4_ = 0;
  __last.sib_ = (Siblings *)local_30._0_8_;
  __last.v_ = local_30._8_2_;
  __last._10_2_ = local_30._10_2_;
  std::vector<short,std::allocator<short>>::
  vector<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>,void>
            ((vector<short,std::allocator<short>> *)&local_60,__first,__last,&local_61);
  iVar2 = (int)((ulong)((long)local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 1);
  nbVertices = iVar2 + codimension;
  if ((nbVertices <= this->dimension_ + 1) && ((codimension != 0 || (iVar2 <= this->dimension_)))) {
    psVar3 = local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        psVar4 = psVar3 + 1;
        if (psVar4 == local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_00163213;
        sVar1 = *psVar3;
        psVar3 = psVar4;
      } while (*psVar4 <= sVar1);
      if (psVar4 != local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        __assert_fail("std::is_sorted(copy.begin(), copy.end(), std::greater<Vertex_handle>())",
                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                      ,0x5b3,
                      "Cofaces_simplex_range Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::cofaces_simplex_range(const Simplex_handle, int) const [SimplexTreeOptions = Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence]"
                     );
      }
    }
LAB_00163213:
    rec_coface(this,&local_60,&this->root_,1,__return_storage_ptr__,codimension == 0,nbVertices);
  }
  if (local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (short *)0x0) {
    operator_delete(local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Cofaces_simplex_range cofaces_simplex_range(const Simplex_handle simplex, int codimension) const{
    // codimension must be positive or null integer
    assert(codimension >= 0);

    if constexpr (Options::link_nodes_by_label) {
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      Static_vertex_vector simp(rg.begin(), rg.end());
      // must be sorted in decreasing order
      assert(std::is_sorted(simp.begin(), simp.end(), std::greater<Vertex_handle>()));
      auto range = Optimized_star_simplex_range(Optimized_star_simplex_iterator(this, std::move(simp)),
                                                Optimized_star_simplex_iterator());
      // Lazy filtered range
      Fast_cofaces_predicate select(this, codimension, this->dimension(simplex));
      return boost::adaptors::filter(range, select);
    } else {
      Cofaces_simplex_range cofaces;
      Simplex_vertex_range rg = simplex_vertex_range(simplex);
      std::vector<Vertex_handle> copy(rg.begin(), rg.end());
      if (codimension + static_cast<int>(copy.size()) > dimension_ + 1 ||
          (codimension == 0 && static_cast<int>(copy.size()) > dimension_))  // n+codimension greater than dimension_
        return cofaces;
      // must be sorted in decreasing order
      assert(std::is_sorted(copy.begin(), copy.end(), std::greater<Vertex_handle>()));
      bool star = codimension == 0;
      rec_coface(copy, &root_, 1, cofaces, star, codimension + static_cast<int>(copy.size()));
      return cofaces;
    }
  }